

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp_fixup_pass.cpp
# Opt level: O1

Status __thiscall spvtools::opt::InterpFixupPass::Process(InterpFixupPass *this)

{
  IRContext *pIVar1;
  Module *pMVar2;
  pointer puVar3;
  byte bVar4;
  long *plVar5;
  pointer puVar6;
  bool changed;
  InstructionFolder folder;
  byte local_71;
  IRContext *local_70;
  long *local_68;
  long *local_60;
  _Any_data local_58;
  code *local_48;
  code *pcStack_40;
  
  local_71 = 0;
  pIVar1 = (this->super_Pass).context_;
  plVar5 = (long *)operator_new(0x90);
  plVar5[1] = (long)(plVar5 + 7);
  plVar5[2] = 1;
  plVar5[3] = 0;
  plVar5[4] = 0;
  *(undefined4 *)(plVar5 + 5) = 0x3f800000;
  plVar5[6] = 0;
  plVar5[7] = 0;
  *(undefined4 *)(plVar5 + 9) = 0;
  plVar5[10] = 0;
  plVar5[0xb] = (long)(plVar5 + 9);
  plVar5[0xc] = (long)(plVar5 + 9);
  plVar5[0xd] = 0;
  plVar5[0xe] = (long)pIVar1;
  plVar5[0xf] = 0;
  plVar5[0x10] = 0;
  plVar5[0x11] = 0;
  *plVar5 = (long)&PTR__FoldingRules_003f1088;
  local_68 = (long *)operator_new(0x90);
  local_68[1] = (long)(local_68 + 7);
  local_68[2] = 1;
  local_68[3] = 0;
  local_68[4] = 0;
  *(undefined4 *)(local_68 + 5) = 0x3f800000;
  local_68[6] = 0;
  local_68[7] = 0;
  *(undefined4 *)(local_68 + 9) = 0;
  local_68[10] = 0;
  local_68[0xb] = (long)(local_68 + 9);
  local_68[0xc] = (long)(local_68 + 9);
  local_68[0xd] = 0;
  local_68[0xe] = (long)pIVar1;
  local_68[0xf] = 0;
  local_68[0x10] = 0;
  local_68[0x11] = 0;
  *local_68 = (long)&PTR__ConstantFoldingRules_003f10c8;
  local_70 = pIVar1;
  local_60 = plVar5;
  (**(code **)(*plVar5 + 0x10))(plVar5);
  (**(code **)(*local_68 + 0x10))();
  pMVar2 = (((this->super_Pass).context_)->module_)._M_t.
           super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
           .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl;
  puVar6 = *(pointer *)
            &(pMVar2->functions_).
             super__Vector_base<std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>,_std::allocator<std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>_>_>
             ._M_impl;
  puVar3 = *(pointer *)
            ((long)&(pMVar2->functions_).
                    super__Vector_base<std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>,_std::allocator<std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>_>_>
            + 8);
  if (puVar6 != puVar3) {
    do {
      local_58._M_unused._M_object = &local_71;
      pcStack_40 = std::
                   _Function_handler<void_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/interp_fixup_pass.cpp:111:22)>
                   ::_M_invoke;
      local_48 = std::
                 _Function_handler<void_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/interp_fixup_pass.cpp:111:22)>
                 ::_M_manager;
      local_58._8_8_ = &local_70;
      Function::ForEachInst
                ((Function *)
                 (puVar6->_M_t).
                 super___uniq_ptr_impl<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>
                 ,(function<void_(spvtools::opt::Instruction_*)> *)&local_58,false,false);
      if (local_48 != (code *)0x0) {
        (*local_48)(&local_58,&local_58,__destroy_functor);
      }
      puVar6 = puVar6 + 1;
    } while (puVar6 != puVar3);
  }
  bVar4 = local_71;
  if (local_60 != (long *)0x0) {
    (**(code **)(*local_60 + 8))();
  }
  local_60 = (long *)0x0;
  if (local_68 != (long *)0x0) {
    (**(code **)(*local_68 + 8))();
  }
  return bVar4 ^ SuccessWithoutChange;
}

Assistant:

Pass::Status InterpFixupPass::Process() {
  bool changed = false;

  // Traverse the body of the functions to replace instructions that require
  // the extensions.
  InstructionFolder folder(
      context(),
      std::unique_ptr<InterpFoldingRules>(new InterpFoldingRules(context())),
      MakeUnique<InterpConstFoldingRules>(context()));
  for (Function& func : *get_module()) {
    func.ForEachInst([&changed, &folder](Instruction* inst) {
      if (folder.FoldInstruction(inst)) {
        changed = true;
      }
    });
  }

  return changed ? Status::SuccessWithChange : Status::SuccessWithoutChange;
}